

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texel_fetch_invalid_p
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  DataType DVar2;
  DataType samplerDataType;
  bool bVar3;
  ContextType ctxType;
  char *__s;
  DataType dataType;
  long lVar4;
  DataType pDataType;
  DataType in_stack_fffffffffffffbe8;
  string shaderSource;
  allocator<char> local_3e1;
  long local_3e0;
  long local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar3) {
    (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
              (&local_390,(_anonymous_namespace_ *)0x2d,dataType);
    bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    if (!bVar3) {
      return;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"texelFetch: Invalid P type.",(allocator<char> *)&local_3d0);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    shaderType = (&(anonymous_namespace)::s_shaders)[lVar4];
    bVar3 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar3) {
      local_3d8 = lVar4;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,__s,&local_3e1);
      std::operator+(&shaderSource,"Verify shader: ",&local_3d0);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_3d0);
      lVar4 = -0x10;
      while (lVar4 != 0) {
        DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar4);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x42,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x43,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x44,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar4 != -0xc) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_uintTypes + lVar4);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x42,DVar2,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          std::__cxx11::string::string((string *)&local_3b0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_3b0);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x43,DVar2,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x44,DVar2,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          std::__cxx11::string::string((string *)&local_d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        DVar2 = *(DataType *)
                 (
                 "GL_EXT_primitive_bounding_box required in 310 es shaders to use AEP features. Version 320 es shaders do not require suffixes."
                 + lVar4);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x42,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x43,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_110,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&shaderSource);
        pDataType = TYPE_INT;
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x44,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_130,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x55,DVar1,pDataType);
        std::__cxx11::string::string((string *)&local_150,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x56,DVar1,pDataType);
        std::__cxx11::string::string((string *)&local_170,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x57,DVar1,pDataType);
        std::__cxx11::string::string((string *)&local_190,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&shaderSource);
        local_3e0 = lVar4;
        if (lVar4 != -0x10) {
          samplerDataType = *(DataType *)((long)&(anonymous_namespace)::s_uintTypes + lVar4);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x55,samplerDataType,pDataType);
          std::__cxx11::string::string((string *)&local_1b0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x56,samplerDataType,pDataType);
          std::__cxx11::string::string((string *)&local_1d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x57,samplerDataType,pDataType);
          std::__cxx11::string::string((string *)&local_1f0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x55,DVar2,pDataType);
        std::__cxx11::string::string((string *)&local_210,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x56,DVar2,pDataType);
        std::__cxx11::string::string((string *)&local_230,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x57,DVar2,pDataType);
        std::__cxx11::string::string((string *)&local_250,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x58,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_270,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x59,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_290,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x5a,DVar1,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_2b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (local_3e0 != -8) {
          DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_uintTypes + local_3e0);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x58,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          std::__cxx11::string::string((string *)&local_2d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_2d0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x59,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          std::__cxx11::string::string((string *)&local_2f0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_2f0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x5a,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          std::__cxx11::string::string((string *)&local_310,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_310);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x58,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_330,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_330);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x59,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_350,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_350);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x5a,DVar2,TYPE_INT,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::string((string *)&local_370,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&shaderSource);
        lVar4 = local_3e0 + 4;
      }
      NegativeTestContext::endSection(ctx);
      lVar4 = local_3d8;
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texel_fetch_invalid_p (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
	{
		ctx.beginSection("texelFetch: Invalid P type.");
		for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
		{
			if (ctx.isShaderSupported(s_shaders[shaderNdx]))
			{
				ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
				{
					// SAMPLER_2D_MULTISAMPLE
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT_VEC2)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_BUFFER
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}

					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_2D_MULTISAMPLE_ARRAY
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT_VEC3)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				ctx.endSection();
			}
		}
		ctx.endSection();
	}
}